

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

int CaptureSummary::compare_string(char *x,char *y)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  
  bVar1 = *x;
  bVar3 = *y;
  if (bVar1 != 0 && bVar1 == bVar3) {
    lVar4 = 1;
    do {
      bVar1 = x[lVar4];
      bVar3 = y[lVar4];
      if (bVar1 == 0) break;
      lVar4 = lVar4 + 1;
    } while (bVar1 == bVar3);
  }
  iVar2 = 1;
  if (bVar3 <= bVar1) {
    iVar2 = -(uint)(bVar3 < bVar1);
  }
  return iVar2;
}

Assistant:

int CaptureSummary::compare_string(char const * x, char const * y)
{
    int ret = 0;
    uint8_t ux, uy;

    while (*x == *y && *x != 0)
    {
        x++;
        y++;
    }

    ux = (uint8_t)*x;
    uy = (uint8_t)*y;

    if (ux < uy)
    {
        ret = 1;
    }
    else if (ux > uy)
    {
        ret = -1;
    }

    return ret;
}